

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

void REVassoc_split_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVaction EVar1;
  CMFormat format;
  EV_int_response response;
  undefined4 local_28;
  EVaction local_24;
  
  format = CMlookup_format(conn->cm,EV_int_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_int_response_formats);
  }
  EVar1 = EVassoc_split_action(cm,*(EVstone *)((long)data + 4),*(EVstone **)((long)data + 0x10));
  _local_28 = CONCAT44(EVar1,*data);
  CMwrite(conn,format,&local_28);
  return;
}

Assistant:

static void
REVassoc_split_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVassoc_split_action_request *request = (EVassoc_split_action_request *) data;
    EVaction ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVassoc_split_action(cm, request->stone, request->target_list);
    response.ret = (int) ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}